

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall wasm::PrintExpressionContents::visitTry(PrintExpressionContents *this,Try *curr)

{
  ostream *stream;
  undefined1 auVar1 [16];
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  stream = this->o;
  uStack_28 = in_RAX;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"try",3);
  Colors::outputColorCode(stream,"\x1b[0m");
  if ((curr->name).super_IString.str._M_str != (char *)0x0) {
    uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)((long)&uStack_28 + 7),1);
    Name::print(&curr->name,this->o);
  }
  if (1 < (curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id) {
    uStack_28._0_7_ = CONCAT16(0x20,(undefined6)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)((long)&uStack_28 + 6),1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.
                   id;
    PrintSExpression::printBlockType(this->parent,(Signature)(auVar1 << 0x40));
  }
  return;
}

Assistant:

void visitTry(Try* curr) {
    printMedium(o, "try");
    if (curr->name.is()) {
      o << ' ';
      curr->name.print(o);
    }
    if (curr->type.isConcrete()) {
      o << ' ';
      printBlockType(Signature(Type::none, curr->type));
    }
  }